

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  bool bVar1;
  ostream *poVar2;
  vector<int,_std::allocator<int>_> *__x;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  initializer_list<int> __l;
  vector<int,_std::allocator<int>_> ans;
  vector<int,_std::allocator<int>_> coeffs;
  Diophantine local_f8;
  Diophantine local_d8;
  _Vector_base<int,_std::allocator<int>_> local_b8;
  Population population;
  
  population.diophantine_.coeffs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x600000005;
  population.diophantine_.result = 7;
  population.diophantine_._28_4_ = 8;
  population.diophantine_.coeffs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x200000001;
  population.diophantine_.coeffs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x400000003;
  population.population_.super__Vector_base<DNA,_std::allocator<DNA>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 9;
  __l._M_len = 9;
  __l._M_array = (iterator)&population;
  std::vector<int,_std::allocator<int>_>::vector(&coeffs,__l,(allocator_type *)&local_f8);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_b8,&coeffs);
  local_f8.coeffs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = local_b8._M_impl.super__Vector_impl_data._M_start;
  local_f8.coeffs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = local_b8._M_impl.super__Vector_impl_data._M_finish;
  local_f8.coeffs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = local_b8._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_b8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f8.result = 10000;
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_b8);
  Diophantine::Diophantine(&local_d8,&local_f8);
  Population::Population(&population,&local_d8,0.01,0x32);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_d8);
  uVar4 = 1;
  uVar3 = 0;
  while( true ) {
    bVar1 = Population::AnswerReady(&population);
    if (bVar1 || 49999 < uVar3) break;
    Population::evolve(&population);
    if ((short)((short)((uVar4 & 0xffff) / 100) * 100 + -1) == (short)uVar3) {
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,uVar3 + 1);
      std::operator<<(poVar2,"\n");
    }
    uVar4 = uVar4 + 1;
    uVar3 = uVar3 + 1;
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"population size = ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::operator<<(poVar2,"\n");
  std::operator<<((ostream *)&std::cout,"mutation rate = ");
  poVar2 = std::ostream::_M_insert<double>(0.01);
  std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<((ostream *)&std::cout,"iterations = ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,uVar3);
  std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<((ostream *)&std::cout,"answer is ready = ");
  Population::AnswerReady(&population);
  poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
  std::operator<<(poVar2,"\n");
  __x = Population::GetAnswer(&population);
  std::vector<int,_std::allocator<int>_>::vector(&ans,__x);
  uVar5 = 0;
  while (uVar5 < (ulong)((long)ans.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                         (long)ans.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start >> 2)) {
    poVar2 = (ostream *)
             std::ostream::operator<<
                       ((ostream *)&std::cout,
                        ans.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar5]);
    poVar2 = std::operator<<(poVar2,"*");
    std::ostream::operator<<
              (poVar2,coeffs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar5]);
    uVar5 = uVar5 + 1;
    if (uVar5 != (long)ans.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)ans.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start >> 2) {
      std::operator<<((ostream *)&std::cout," + ");
    }
  }
  poVar2 = std::operator<<((ostream *)&std::cout," = ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,10000);
  std::operator<<(poVar2,"\n");
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&ans.super__Vector_base<int,_std::allocator<int>_>);
  Population::~Population(&population);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_f8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&coeffs.super__Vector_base<int,_std::allocator<int>_>);
  return 0;
}

Assistant:

int main() {
    vector<int> coeffs = {1, 2, 3, 4, 5, 6, 7, 8, 9};
    int result = 10000;
    Diophantine diophantine(coeffs, result);
    Population population(diophantine, mutationRate, populationSize);

    int iterations = 0;

    while (!population.AnswerReady() && iterations < 50000) {
        ++iterations;
        population.evolve();
        if (iterations % 100 == 0) {
            cout << iterations << "\n";
        }
    }

    cout << "population size = " << populationSize << "\n";
    cout << "mutation rate = " << mutationRate << "\n";
    cout << "iterations = " << iterations << "\n";
    cout << "answer is ready = " << population.AnswerReady() << "\n";

    auto ans = population.GetAnswer();

    for (int i = 0; i < ans.size(); ++i) {
        cout << ans[i]  << "*"  << coeffs[i];
        if (i + 1 != ans.size()) {
            cout << " + ";
        }
    }
    cout << " = " << result << "\n";

    return 0;
}